

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O1

void cmLinkItemGraphVisitor::GetDependencies
               (cmGeneratorTarget *target,string *config,DependencyMap *dependencies)

{
  pointer pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *t;
  pointer ppcVar3;
  cmLinkImplementationLibraries *pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  cmLinkInterfaceLibraries *pcVar7;
  iterator iVar8;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> *this;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar9;
  _Base_ptr p_Var10;
  cmLinkImplItem *lib;
  pointer __y;
  _Rb_tree_header *p_Var11;
  cmLinkItem *lib_1;
  pointer this_00;
  pointer ppcVar12;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  cmLinkItem objectItem;
  DependencyType local_e4;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_e0;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_98;
  cmLinkItem local_80;
  cmMakefile *local_38;
  
  pcVar4 = cmGeneratorTarget::GetLinkImplementationLibraries(target,config,Link);
  if (pcVar4 != (cmLinkImplementationLibraries *)0x0) {
    __y = (pcVar4->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
          _M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pcVar4->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__y != pcVar1) {
      do {
        psVar5 = cmLinkItem::AsStr_abi_cxx11_(&__y->super_cmLinkItem);
        local_80.String._M_dataplus._M_p._0_4_ = 2;
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
        pair<cmLinkItemGraphVisitor::DependencyType,_const_cmLinkImplItem_&,_true>
                  (&local_e0,(DependencyType *)&local_80,__y);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar5);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar6,&local_e0);
        if (local_e0.second.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.second.Backtrace.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second.String._M_dataplus._M_p != &local_e0.second.String.field_2) {
          operator_delete(local_e0.second.String._M_dataplus._M_p,
                          local_e0.second.String.field_2._M_allocated_capacity + 1);
        }
        __y = __y + 1;
      } while (__y != pcVar1);
    }
  }
  pcVar7 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Usage);
  if (pcVar7 != (cmLinkInterfaceLibraries *)0x0) {
    this_00 = (pcVar7->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pcVar7->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (this_00 != pcVar2) {
      do {
        psVar5 = cmLinkItem::AsStr_abi_cxx11_(this_00);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                ::find(&dependencies->_M_t,psVar5);
        if ((_Rb_tree_header *)iVar8._M_node == &(dependencies->_M_t)._M_impl.super__Rb_tree_header)
        {
          local_80.String._M_dataplus._M_p._0_4_ = 0;
          std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
          pair<cmLinkItemGraphVisitor::DependencyType,_true>
                    (&local_e0,(DependencyType *)&local_80,this_00);
          this = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar5);
        }
        else {
          local_80.String._M_dataplus._M_p._0_4_ = 1;
          std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
          pair<cmLinkItemGraphVisitor::DependencyType,_true>
                    (&local_e0,(DependencyType *)&local_80,this_00);
          this = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar5);
        }
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(this,&local_e0);
        if (local_e0.second.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.second.Backtrace.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second.String._M_dataplus._M_p != &local_e0.second.String.field_2) {
          operator_delete(local_e0.second.String._M_dataplus._M_p,
                          local_e0.second.String.field_2._M_allocated_capacity + 1);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pcVar2);
    }
  }
  local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectLibrariesCMP0026(target,&local_98);
  ppcVar3 = local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    ppcVar12 = local_98.
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar12);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
              ::find(&dependencies->_M_t,psVar5);
      if ((_Rb_tree_header *)iVar8._M_node == &(dependencies->_M_t)._M_impl.super__Rb_tree_header) {
        t = *ppcVar12;
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc0);
        cmLinkItem::cmLinkItem(&local_80,t,false,(cmListFileBacktrace *)&stack0xffffffffffffffc0);
        if (local_38 != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
        local_e4 = Object;
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
        pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem_&,_true>
                  (&local_e0,&local_e4,&local_80);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar5);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar6,&local_e0);
        if (local_e0.second.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.second.Backtrace.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second.String._M_dataplus._M_p != &local_e0.second.String.field_2) {
          operator_delete(local_e0.second.String._M_dataplus._M_p,
                          local_e0.second.String.field_2._M_allocated_capacity + 1);
        }
        if (local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80.String._M_dataplus._M_p._4_4_,
                        local_80.String._M_dataplus._M_p._0_4_) != &local_80.String.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_80.String._M_dataplus._M_p._4_4_,
                                   local_80.String._M_dataplus._M_p._0_4_),
                          local_80.String.field_2._M_allocated_capacity + 1);
        }
      }
      ppcVar12 = ppcVar12 + 1;
    } while (ppcVar12 != ppcVar3);
  }
  psVar9 = cmGeneratorTarget::GetUtilityItems(target);
  p_Var10 = (psVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(psVar9->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var11) {
    do {
      psVar5 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)(p_Var10 + 1));
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
              ::find(&dependencies->_M_t,psVar5);
      if ((_Rb_tree_header *)iVar8._M_node == &(dependencies->_M_t)._M_impl.super__Rb_tree_header) {
        local_80.String._M_dataplus._M_p._0_4_ = 4;
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
        pair<cmLinkItemGraphVisitor::DependencyType,_true>
                  (&local_e0,(DependencyType *)&local_80,(cmLinkItem *)(p_Var10 + 1));
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar5);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar6,&local_e0);
        if (local_e0.second.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.second.Backtrace.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second.String._M_dataplus._M_p != &local_e0.second.String.field_2) {
          operator_delete(local_e0.second.String._M_dataplus._M_p,
                          local_e0.second.String.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var11);
  }
  if (local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLinkItemGraphVisitor::GetDependencies(cmGeneratorTarget const& target,
                                             std::string const& config,
                                             DependencyMap& dependencies)
{
  const auto* implementationLibraries = target.GetLinkImplementationLibraries(
    config, cmGeneratorTarget::LinkInterfaceFor::Link);
  if (implementationLibraries != nullptr) {
    for (auto const& lib : implementationLibraries->Libraries) {
      auto const& name = lib.AsStr();
      dependencies[name] = Dependency(DependencyType::LinkPrivate, lib);
    }
  }

  const auto* interfaceLibraries = target.GetLinkInterfaceLibraries(
    config, &target, cmGeneratorTarget::LinkInterfaceFor::Usage);
  if (interfaceLibraries != nullptr) {
    for (auto const& lib : interfaceLibraries->Libraries) {
      auto const& name = lib.AsStr();
      if (dependencies.find(name) != dependencies.cend()) {
        dependencies[name] = Dependency(DependencyType::LinkPublic, lib);
      } else {
        dependencies[name] = Dependency(DependencyType::LinkInterface, lib);
      }
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  target.GetObjectLibrariesCMP0026(objectLibraries);
  for (auto const& lib : objectLibraries) {
    auto const& name = lib->GetName();
    if (dependencies.find(name) == dependencies.cend()) {
      auto objectItem = cmLinkItem(lib, false, lib->GetBacktrace());
      dependencies[name] = Dependency(DependencyType::Object, objectItem);
    }
  }

  auto const& utilityItems = target.GetUtilityItems();
  for (auto const& item : utilityItems) {
    auto const& name = item.AsStr();
    if (dependencies.find(name) == dependencies.cend()) {
      dependencies[name] = Dependency(DependencyType::Utility, item);
    }
  }
}